

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

void wtree(wtree_object wt,double *inp)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  char *__ptr;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  int iVar10;
  char *pcVar11;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  double dVar16;
  ulong local_38;
  
  uVar3 = wt->siglength;
  local_38 = (ulong)(int)uVar3;
  uVar8 = wt->J;
  uVar14 = (ulong)uVar8;
  lVar4 = (long)(int)uVar8;
  wt->length[lVar4 + 1] = uVar3;
  wt->outlength = 0;
  wt->zpad = 0;
  __ptr = (char *)malloc(local_38 << 3);
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    *(double *)(__ptr + uVar5 * 8) = inp[uVar5];
  }
  iVar7 = wt->wave->lpd_len;
  iVar2 = strcmp(wt->ext,"per");
  if (iVar2 == 0) {
    iVar7 = 2;
    iVar2 = 0;
    uVar5 = local_38;
    for (uVar6 = uVar14; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      dVar16 = ceil((double)(int)uVar5 * 0.5);
      uVar3 = (uint)dVar16;
      uVar5 = (ulong)uVar3;
      wt->length[uVar6] = uVar3;
      iVar2 = iVar7 * uVar3 + wt->outlength;
      wt->outlength = iVar2;
      iVar7 = iVar7 * 2;
    }
    wt->length[0] = wt->length[1];
    if ((int)uVar8 < 1) {
      uVar14 = 0;
    }
    iVar7 = 0;
    uVar3 = 1;
    for (uVar5 = 0; uVar5 != uVar14; uVar5 = uVar5 + 1) {
      iVar13 = *(int *)((long)wt + (lVar4 - uVar5) * 4 + 0x50);
      iVar2 = iVar2 - iVar13 * uVar3 * 2;
      pcVar11 = wt[1].method + (long)iVar7 * 8 + -0x10;
      uVar6 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar6 = 0;
      }
      pcVar12 = wt[1].method + (long)iVar2 * 8 + -0x10;
      while (bVar15 = uVar6 != 0, uVar6 = uVar6 - 1, bVar15) {
        pcVar9 = __ptr;
        if (uVar5 != 0) {
          pcVar9 = pcVar11;
        }
        wtree_per(wt,(double *)pcVar9,(int)local_38,(double *)pcVar12,iVar13,
                  (double *)(pcVar12 + (long)iVar13 * 8));
        pcVar11 = pcVar11 + (long)(int)local_38 * 8;
        pcVar12 = pcVar12 + (long)(iVar13 * 2) * 8;
      }
      local_38 = (ulong)*(uint *)((long)wt + (lVar4 - uVar5) * 4 + 0x50);
      iVar7 = iVar2;
      uVar3 = uVar3 * 2;
    }
  }
  else {
    iVar2 = strcmp(wt->ext,"sym");
    if (iVar2 != 0) {
      printf("Signal extension can be either per or sym");
      exit(-1);
    }
    iVar2 = 2;
    uVar3 = 0;
    uVar5 = local_38;
    for (; 0 < (int)uVar14; uVar14 = uVar14 - 1) {
      dVar16 = ceil((double)((int)uVar5 + iVar7 + -2) * 0.5);
      uVar3 = (uint)dVar16;
      uVar5 = (ulong)uVar3;
      wt->length[uVar14] = uVar3;
      uVar3 = iVar2 * uVar3 + wt->outlength;
      wt->outlength = uVar3;
      iVar2 = iVar2 * 2;
    }
    wt->length[0] = wt->length[1];
    uVar14 = 0;
    if (0 < (int)uVar8) {
      uVar14 = (ulong)uVar8;
    }
    uVar5 = uVar14;
    uVar8 = 1;
    for (uVar6 = 0; uVar6 != uVar14; uVar6 = uVar6 + 1) {
      iVar7 = *(int *)((long)wt + (lVar4 - uVar6) * 4 + 0x50);
      uVar3 = uVar3 - iVar7 * uVar8 * 2;
      pcVar11 = wt[1].method + (long)(int)uVar5 * 8 + -0x10;
      uVar5 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar5 = 0;
      }
      pcVar12 = wt[1].method + (long)(int)uVar3 * 8 + -0x10;
      while (bVar15 = uVar5 != 0, uVar5 = uVar5 - 1, bVar15) {
        pcVar9 = __ptr;
        if (uVar6 != 0) {
          pcVar9 = pcVar11;
        }
        wtree_sym(wt,(double *)pcVar9,(int)local_38,(double *)pcVar12,iVar7,
                  (double *)(pcVar12 + (long)iVar7 * 8));
        pcVar11 = pcVar11 + (long)(int)local_38 * 8;
        pcVar12 = pcVar12 + (long)(iVar7 * 2) * 8;
      }
      local_38 = (ulong)*(uint *)((long)wt + (lVar4 - uVar6) * 4 + 0x50);
      uVar5 = (ulong)uVar3;
      uVar8 = uVar8 * 2;
    }
  }
  uVar3 = wt->J;
  iVar7 = wt->outlength + wt->length[(int)uVar3] * -2;
  uVar5 = 0;
  uVar14 = 0;
  if (0 < (int)uVar3) {
    uVar14 = (ulong)uVar3;
  }
  iVar2 = 2;
  iVar13 = 0;
  for (; uVar5 != uVar14; uVar5 = uVar5 + 1) {
    piVar1 = wt->nodelength;
    iVar10 = iVar13 + iVar2;
    lVar4 = (long)iVar13;
    iVar13 = iVar7;
    for (; iVar10 != lVar4; lVar4 = lVar4 + 1) {
      piVar1[lVar4] = iVar13;
      iVar13 = iVar13 + *(int *)((long)wt + ((long)(int)uVar3 - uVar5) * 4 + 0x50);
    }
    iVar2 = iVar2 * 2;
    iVar7 = iVar7 - wt->length[(int)(~(uint)uVar5 + uVar3)] * iVar2;
    iVar13 = iVar10;
  }
  piVar1 = wt->coeflength;
  *piVar1 = wt->siglength;
  for (uVar5 = 0; uVar14 != uVar5; uVar5 = uVar5 + 1) {
    piVar1[uVar5 + 1] = wt->length[(int)uVar3];
    uVar3 = uVar3 - 1;
  }
  free(__ptr);
  return;
}

Assistant:

void wtree(wtree_object wt,const double *inp) {
	int i,J,temp_len,iter,N,lp,p2,k,N2,Np;
	int len_cA,t,t2,it1;
	double *orig;

	temp_len = wt->siglength;
	J = wt->J;
	wt->length[J + 1] = temp_len;
	wt->outlength = 0;
	wt->zpad = 0;
	orig = (double*)malloc(sizeof(double)* temp_len);
	/*
	if ((temp_len % 2) == 0) {
		wt->zpad = 0;
		orig = (double*)malloc(sizeof(double)* temp_len);
	}
	else {
		wt->zpad = 1;
		temp_len++;
		orig = (double*)malloc(sizeof(double)* temp_len);
	}
	*/
	for (i = 0; i < wt->siglength; ++i) {
		orig[i] = inp[i];
	}

	if (wt->zpad == 1) {
		orig[temp_len - 1] = orig[temp_len - 2];
	}

	N = temp_len;
	lp = wt->wave->lpd_len;
        p2 = 1;

	if (!strcmp(wt->ext,"per")) {
		i = J;
                p2 = 2;
		while (i > 0) {
			N = (int)ceil((double)N / 2.0);
			wt->length[i] = N;
			wt->outlength += p2 * (wt->length[i]);
			i--;
                        p2 *= 2;
		}
		wt->length[0] = wt->length[1];

		N2 = N = wt->outlength;
                p2 = 1;
		for (iter = 0; iter < J; ++iter) {
			len_cA = wt->length[J - iter];
                        N2 -= 2 * p2 * len_cA;
                        N = N2;
                        for(k = 0; k < p2;++k) {
                            if (iter == 0) {
                               wtree_per(wt, orig, temp_len, wt->params + N, len_cA, wt->params + N + len_cA);
                            } else {
                                wtree_per(wt, wt->params + Np + k * temp_len, temp_len, wt->params + N, len_cA, wt->params + N + len_cA);
                            }
                            N += 2 * len_cA;
                        }

			temp_len = wt->length[J - iter];
			p2 = 2 * p2;
            Np = N2;
		}
	}
	else if (!strcmp(wt->ext,"sym")) {
		//printf("\n YES %s \n", wt->ext);
		i = J;
                p2 = 2;
		while (i > 0) {
			N = N + lp - 2;
			N = (int) ceil((double)N / 2.0);
			wt->length[i] = N;
			wt->outlength += p2 * (wt->length[i]);
			i--;
                        p2 *= 2;
		}
		wt->length[0] = wt->length[1];

		N2 = N = wt->outlength;
                p2 = 1;

                for (iter = 0; iter < J; ++iter) {
			len_cA = wt->length[J - iter];
                        N2 -= 2 * p2 * len_cA;
                        N = N2;
                        for(k = 0; k < p2;++k) {
                            if (iter == 0) {
                                wtree_sym(wt, orig, temp_len, wt->params + N, len_cA, wt->params + N + len_cA);
                            } else {
                                wtree_sym(wt, wt->params + Np + k * temp_len, temp_len, wt->params + N, len_cA, wt->params + N + len_cA);
                            }
                            N += 2 * len_cA;
                        }

			temp_len = wt->length[J - iter];
			p2 = 2 * p2;
            Np = N2;
		}

	}
	else {
		printf("Signal extension can be either per or sym");
		exit(-1);
	}

	J = wt->J;
	t2 = wt->outlength - 2 * wt->length[J];
	p2 = 2;
	it1 = 0;
	for (i = 0; i < J; ++i) {
		t = t2;
		for (k = 0; k < p2; ++k) {
			wt->nodelength[it1] = t;
			it1++;
			t += wt->length[J - i];
		}
		p2 *= 2;
		t2 = t2 - p2 * wt->length[J - i - 1];
	}

	wt->coeflength[0] = wt->siglength;

	for (i = 1; i < J + 1; ++i) {
		wt->coeflength[i] = wt->length[J - i + 1];
	}

	free(orig);
}